

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMatrixUtils.cpp
# Opt level: O3

HighsStatus
assessMatrix(HighsLogOptions *log_options,string *matrix_name,HighsInt vec_dim,HighsInt num_vec,
            bool partitioned,vector<int,_std::allocator<int>_> *matrix_start,
            vector<int,_std::allocator<int>_> *matrix_p_end,
            vector<int,_std::allocator<int>_> *matrix_index,
            vector<double,_std::allocator<double>_> *matrix_value,double small_matrix_value,
            double large_matrix_value)

{
  uint uVar1;
  int *piVar2;
  pointer piVar3;
  pointer pdVar4;
  bool bVar5;
  HighsStatus HVar6;
  uint uVar7;
  pointer pcVar8;
  int iVar9;
  char *pcVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  HighsStatus HVar14;
  long lVar15;
  long lVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  HighsInt component;
  u8 meta;
  HighsHashTable<int,_void> index_set;
  u64 maxPos;
  u64 startPos;
  u64 pos;
  vector<double,_std::allocator<double>_> *pvVar20;
  undefined4 uVar22;
  undefined8 uVar21;
  uint local_e4;
  int local_e0;
  u8 local_d9;
  int local_d8;
  HighsInt local_d4;
  double local_d0;
  double local_c8;
  ulong local_c0;
  ulong local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  ulong local_98;
  long local_90;
  long local_88;
  double local_80;
  long local_78;
  HighsHashTable<int,_void> local_70;
  u64 local_48;
  u64 local_40;
  u64 local_38;
  
  pvVar20 = matrix_value;
  local_d4 = vec_dim;
  local_a0 = small_matrix_value;
  local_80 = large_matrix_value;
  HVar6 = assessMatrixDimensions
                    (log_options,num_vec,partitioned,matrix_start,matrix_p_end,matrix_index,
                     matrix_value);
  if (HVar6 != kError) {
    piVar2 = (matrix_start->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (*piVar2 == 0) {
      local_90 = (long)num_vec;
      uVar7 = 0;
      uVar12 = 0;
      if (partitioned) {
        uVar12 = (ulong)(uint)*(matrix_p_end->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                               .super__Vector_impl_data._M_start;
      }
      uVar1 = piVar2[local_90];
      uVar22 = (undefined4)((ulong)pvVar20 >> 0x20);
      if (0 < num_vec) {
        uVar11 = 0;
        uVar13 = 0;
        do {
          uVar7 = piVar2[uVar11];
          if ((int)uVar7 < (int)uVar13) {
            pcVar8 = (matrix_name->_M_dataplus)._M_p;
            pcVar10 = "%s matrix packed vector %d has illegal start of %d < %d = previous start\n";
            goto LAB_00378e69;
          }
          if ((partitioned) &&
             (uVar13 = (matrix_p_end->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start[uVar11], uVar12 = (ulong)uVar13,
             (int)uVar13 < (int)uVar7)) {
            pcVar8 = (matrix_name->_M_dataplus)._M_p;
            uVar21 = CONCAT44(uVar22,uVar7);
            pcVar10 = "%s matrix packed vector %d has illegal partition end of %d < %d =  start\n";
            goto LAB_00378e6c;
          }
          uVar11 = uVar11 + 1;
          uVar13 = uVar7;
        } while ((uint)num_vec != uVar11);
      }
      if ((int)uVar1 < (int)uVar7) {
        pcVar8 = (matrix_name->_M_dataplus)._M_p;
        pcVar10 = "%s matrix packed vector %d has illegal start of %d > %d = number of nonzeros\n";
        uVar11 = (ulong)(uint)num_vec;
        uVar13 = uVar1;
LAB_00378e69:
        uVar21 = CONCAT44(uVar22,uVar13);
        uVar12 = (ulong)uVar7;
      }
      else {
        if ((!partitioned) || ((int)uVar12 <= (int)uVar1)) {
          HighsHashTable<int,_void>::HighsHashTable(&local_70);
          uVar11 = 0;
          uVar12 = (ulong)(uint)num_vec;
          if (num_vec < 1) {
            uVar12 = uVar11;
          }
          local_c8 = 0.0;
          local_c0 = 0;
          local_e4 = 0;
          local_d8 = 0;
          local_a8 = 0.0;
          local_d0 = INFINITY;
          local_b0 = INFINITY;
          do {
            if (uVar11 == uVar12) {
              bVar5 = local_d8 != 0;
              if (bVar5) {
                highsLogUser(log_options,kError,
                             "%s matrix packed vector contains %d |values| in [%g, %g] greater than %g\n"
                             ,local_b0,local_a8,local_80,(matrix_name->_M_dataplus)._M_p);
              }
              HVar14 = kOk;
              if (local_e4 != 0) {
                if (partitioned) {
                  highsLogUser(log_options,kError,
                               "%s matrix packed partitioned vector contains %d |values| in [%g, %g] less than or equal to %g: ignored\n"
                               ,local_d0,local_c8,local_a0,(matrix_name->_M_dataplus)._M_p,
                               (ulong)local_e4);
                }
                bVar5 = partitioned || bVar5;
                HVar14 = kOk;
                if (0.0 < local_c8) {
                  HVar14 = kWarning;
                  highsLogUser(log_options,kWarning,
                               "%s matrix packed vector contains %d |values| in [%g, %g] less than or equal to %g: ignored\n"
                               ,local_d0,local_c8,local_a0,(matrix_name->_M_dataplus)._M_p,
                               (ulong)local_e4);
                }
              }
              (matrix_start->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[local_90] = (int)local_c0;
              HVar6 = kError;
              if (!bVar5) {
                HVar6 = HVar14;
              }
LAB_0037913a:
              HighsHashTable<int,_void>::~HighsHashTable(&local_70);
              return HVar6;
            }
            piVar3 = (matrix_start->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            uVar7 = piVar3[uVar11];
            piVar3[uVar11] = (int)local_c0;
            local_b8 = uVar11;
            if ((int)uVar7 < piVar3[uVar11 + 1]) {
              lVar16 = (long)(int)uVar7;
              local_88 = lVar16 * 4;
              local_78 = (ulong)(uint)-piVar3[uVar11 + 1] + (ulong)uVar7;
              lVar15 = 0;
              local_98 = (ulong)uVar7;
              do {
                uVar22 = (undefined4)((ulong)pvVar20 >> 0x20);
                local_e0 = *(int *)((long)(matrix_index->
                                          super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                          super__Vector_impl_data._M_start + lVar15 * 4 + local_88);
                if (local_e0 < 0) {
                  pcVar10 = "%s matrix packed vector %d, entry %d, is illegal index %d\n";
LAB_0037910d:
                  highsLogUser(log_options,kError,pcVar10,(matrix_name->_M_dataplus)._M_p,local_b8,
                               (ulong)(uint)((int)local_98 + (int)lVar15),CONCAT44(uVar22,local_e0))
                  ;
LAB_00379134:
                  HVar6 = kError;
                  goto LAB_0037913a;
                }
                if (local_d4 <= local_e0) {
                  highsLogUser(log_options,kError,
                               "%s matrix packed vector %d, entry %d, is illegal index %12d >= %d = vector dimension\n"
                               ,(matrix_name->_M_dataplus)._M_p,local_b8,
                               (ulong)(uint)((int)local_98 + (int)lVar15),CONCAT44(uVar22,local_e0),
                               local_d4);
                  goto LAB_00379134;
                }
                bVar5 = HighsHashTable<int,_void>::findPosition
                                  (&local_70,&local_e0,&local_d9,&local_40,&local_48,&local_38);
                uVar22 = (undefined4)((ulong)pvVar20 >> 0x20);
                if (bVar5 && (_Head_base<0UL,_HighsHashTableEntry<int,_void>_*,_false>)
                             local_70.entries._M_t.
                             super___uniq_ptr_impl<HighsHashTableEntry<int,_void>,_HighsHashTable<int,_void>::OpNewDeleter>
                             ._M_t.
                             super__Tuple_impl<0UL,_HighsHashTableEntry<int,_void>_*,_HighsHashTable<int,_void>::OpNewDeleter>
                             .super__Head_base<0UL,_HighsHashTableEntry<int,_void>_*,_false>.
                             _M_head_impl !=
                             (_Head_base<0UL,_HighsHashTableEntry<int,_void>_*,_false>)0x0) {
                  pcVar10 = "%s matrix packed vector %d, entry %d, is duplicate index %d\n";
                  goto LAB_0037910d;
                }
                dVar17 = ABS((matrix_value->super__Vector_base<double,_std::allocator<double>_>).
                             _M_impl.super__Vector_impl_data._M_start[lVar16 + lVar15]);
                if (local_80 <= dVar17) {
                  dVar18 = dVar17;
                  if (dVar17 <= local_a8) {
                    dVar18 = local_a8;
                  }
                  dVar19 = dVar17;
                  if (local_b0 <= dVar17) {
                    dVar19 = local_b0;
                  }
                  local_d8 = local_d8 + 1;
                  local_b0 = dVar19;
                  local_a8 = dVar18;
                }
                if (dVar17 <= local_a0) {
                  dVar18 = dVar17;
                  if (dVar17 <= local_c8) {
                    dVar18 = local_c8;
                  }
                  if (local_d0 <= dVar17) {
                    dVar17 = local_d0;
                  }
                  local_e4 = local_e4 + 1;
                  local_d0 = dVar17;
                  local_c8 = dVar18;
                }
                else {
                  HighsHashTable<int,void>::insert<int&>
                            ((HighsHashTable<int,void> *)&local_70,&local_e0);
                  piVar3 = (matrix_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start;
                  iVar9 = (int)local_c0;
                  piVar3[iVar9] = *(int *)((long)piVar3 + lVar15 * 4 + local_88);
                  pdVar4 = (matrix_value->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  pdVar4[iVar9] = pdVar4[lVar16 + lVar15];
                  local_c0 = (ulong)(iVar9 + 1);
                }
                lVar15 = lVar15 + 1;
              } while ((int)local_78 + (int)lVar15 != 0);
            }
            uVar11 = local_b8 + 1;
            HighsHashTable<int,_void>::clear(&local_70);
          } while( true );
        }
        pcVar8 = (matrix_name->_M_dataplus)._M_p;
        uVar21 = CONCAT44(uVar22,uVar1);
        pcVar10 = 
        "%s matrix packed vector %d has illegal partition end of %d > %d = number of nonzeros\n";
        uVar11 = (ulong)(uint)num_vec;
      }
LAB_00378e6c:
      highsLogUser(log_options,kError,pcVar10,pcVar8,uVar11,uVar12,uVar21);
    }
    else {
      highsLogUser(log_options,kError,"%s matrix start vector begins with %d rather than 0\n",
                   (matrix_name->_M_dataplus)._M_p);
    }
  }
  return kError;
}

Assistant:

HighsStatus assessMatrix(
    const HighsLogOptions& log_options, const std::string matrix_name,
    const HighsInt vec_dim, const HighsInt num_vec, const bool partitioned,
    vector<HighsInt>& matrix_start, vector<HighsInt>& matrix_p_end,
    vector<HighsInt>& matrix_index, vector<double>& matrix_value,
    const double small_matrix_value, const double large_matrix_value) {
  if (assessMatrixDimensions(log_options, num_vec, partitioned, matrix_start,
                             matrix_p_end, matrix_index,
                             matrix_value) == HighsStatus::kError) {
    return HighsStatus::kError;
  }

  bool error_found = false;
  bool warning_found = false;

  const HighsInt num_nz = matrix_start[num_vec];
  // Assess the starts
  //
  // Check whether the first start is zero
  if (matrix_start[0]) {
    highsLogUser(log_options, HighsLogType::kError,
                 "%s matrix start vector begins with %" HIGHSINT_FORMAT
                 " rather than 0\n",
                 matrix_name.c_str(), matrix_start[0]);
    return HighsStatus::kError;
  }
  // Set up previous_start for a fictitious previous empty packed vector
  HighsInt previous_start = matrix_start[0];
  // Set up this_start to be the first start in case num_vec = 0
  HighsInt this_start = matrix_start[0];
  HighsInt this_p_end = 0;
  if (partitioned) this_p_end = matrix_p_end[0];
  for (HighsInt ix = 0; ix < num_vec; ix++) {
    this_start = matrix_start[ix];
    bool this_start_too_small = this_start < previous_start;
    if (this_start_too_small) {
      highsLogUser(log_options, HighsLogType::kError,
                   "%s matrix packed vector %" HIGHSINT_FORMAT
                   " has illegal start of %" HIGHSINT_FORMAT
                   " < %" HIGHSINT_FORMAT
                   " = "
                   "previous start\n",
                   matrix_name.c_str(), ix, this_start, previous_start);
      return HighsStatus::kError;
    }
    if (partitioned) {
      this_p_end = matrix_p_end[ix];
      bool this_p_end_too_small = this_p_end < this_start;
      if (this_p_end_too_small) {
        highsLogUser(log_options, HighsLogType::kError,
                     "%s matrix packed vector %" HIGHSINT_FORMAT
                     " has illegal partition end of %" HIGHSINT_FORMAT
                     " < %" HIGHSINT_FORMAT
                     " = "
                     " start\n",
                     matrix_name.c_str(), ix, this_p_end, this_start);
        return HighsStatus::kError;
      }
    }
    previous_start = this_start;
  }
  bool this_start_too_big = this_start > num_nz;
  if (this_start_too_big) {
    highsLogUser(log_options, HighsLogType::kError,
                 "%s matrix packed vector %" HIGHSINT_FORMAT
                 " has illegal start of %" HIGHSINT_FORMAT
                 " > %" HIGHSINT_FORMAT
                 " = "
                 "number of nonzeros\n",
                 matrix_name.c_str(), num_vec, this_start, num_nz);
    return HighsStatus::kError;
  }
  if (partitioned) {
    bool this_p_end_too_big = this_p_end > num_nz;
    if (this_p_end_too_big) {
      highsLogUser(log_options, HighsLogType::kError,
                   "%s matrix packed vector %" HIGHSINT_FORMAT
                   " has illegal partition end of %" HIGHSINT_FORMAT
                   " > %" HIGHSINT_FORMAT
                   " = "
                   "number of nonzeros\n",
                   matrix_name.c_str(), num_vec, this_p_end, num_nz);
      return HighsStatus::kError;
    }
  }
  // Assess the indices and values
  // Count the number of acceptable indices/values
  HighsInt num_new_nz = 0;
  HighsInt num_small_values = 0;
  double max_small_value = 0;
  double min_small_value = kHighsInf;
  HighsInt num_large_values = 0;
  double max_large_value = 0;
  double min_large_value = kHighsInf;
  // Use index_map to identify duplicates.
  HighsHashTable<HighsInt> index_set;

  for (HighsInt ix = 0; ix < num_vec; ix++) {
    HighsInt from_el = matrix_start[ix];
    HighsInt to_el = matrix_start[ix + 1];
    // Account for any index-value pairs removed so far
    matrix_start[ix] = num_new_nz;
    for (HighsInt el = from_el; el < to_el; el++) {
      // Check the index
      HighsInt component = matrix_index[el];
      // Check that the index is non-negative
      bool legal_component = component >= 0;
      if (!legal_component) {
        highsLogUser(log_options, HighsLogType::kError,
                     "%s matrix packed vector %" HIGHSINT_FORMAT
                     ", entry %" HIGHSINT_FORMAT
                     ", is illegal index %" HIGHSINT_FORMAT "\n",
                     matrix_name.c_str(), ix, el, component);
        return HighsStatus::kError;
      }
      // Check that the index does not exceed the vector dimension
      legal_component = component < vec_dim;
      if (!legal_component) {
        highsLogUser(log_options, HighsLogType::kError,
                     "%s matrix packed vector %" HIGHSINT_FORMAT
                     ", entry %" HIGHSINT_FORMAT
                     ", is illegal index "
                     "%12" HIGHSINT_FORMAT " >= %" HIGHSINT_FORMAT
                     " = vector dimension\n",
                     matrix_name.c_str(), ix, el, component, vec_dim);
        return HighsStatus::kError;
      }
      // Check that the index has not already occurred.
      legal_component = index_set.find(component) == nullptr;
      if (!legal_component) {
        highsLogUser(log_options, HighsLogType::kError,
                     "%s matrix packed vector %" HIGHSINT_FORMAT
                     ", entry %" HIGHSINT_FORMAT
                     ", is duplicate index %" HIGHSINT_FORMAT "\n",
                     matrix_name.c_str(), ix, el, component);
        return HighsStatus::kError;
      }
      // Check the value
      double abs_value = fabs(matrix_value[el]);
      // Check that the value is not too large
      bool large_value = abs_value >= large_matrix_value;
      if (large_value) {
        if (max_large_value < abs_value) max_large_value = abs_value;
        if (min_large_value > abs_value) min_large_value = abs_value;
        num_large_values++;
      }
      bool ok_value = abs_value > small_matrix_value;
      if (!ok_value) {
        if (max_small_value < abs_value) max_small_value = abs_value;
        if (min_small_value > abs_value) min_small_value = abs_value;
        num_small_values++;
      }
      if (ok_value) {
        // Record where the index has occurred
        index_set.insert(component);
        // Shift the index and value of the OK entry to the new
        // position in the index and value vectors, and increment
        // the new number of nonzeros
        matrix_index[num_new_nz] = matrix_index[el];
        matrix_value[num_new_nz] = matrix_value[el];
        num_new_nz++;
      }
    }  // Loop from_el; to_el
    index_set.clear();
  }  // Loop 0; num_vec
  if (num_large_values) {
    highsLogUser(log_options, HighsLogType::kError,
                 "%s matrix packed vector contains %" HIGHSINT_FORMAT
                 " |values| in [%g, %g] greater than %g\n",
                 matrix_name.c_str(), num_large_values, min_large_value,
                 max_large_value, large_matrix_value);
    error_found = true;
  }
  if (num_small_values) {
    if (partitioned) {
      // Shouldn't happen with a partitioned row-wise matrix since its
      // values should be OK and the code above doesn't handle p_end
      highsLogUser(
          log_options, HighsLogType::kError,
          "%s matrix packed partitioned vector contains %" HIGHSINT_FORMAT
          " |values| in [%g, %g] less than or equal to %g: ignored\n",
          matrix_name.c_str(), num_small_values, min_small_value,
          max_small_value, small_matrix_value);
      error_found = true;
      assert(num_small_values == 0);
    }
    // If explicit zeros are ignored, then no model information is
    // lost, so only report and return a warning if small nonzeros are
    // ignored
    if (max_small_value > 0) {
      highsLogUser(log_options, HighsLogType::kWarning,
                   "%s matrix packed vector contains %" HIGHSINT_FORMAT
                   " |values| in [%g, %g] "
                   "less than or equal to %g: ignored\n",
                   matrix_name.c_str(), num_small_values, min_small_value,
                   max_small_value, small_matrix_value);
      warning_found = true;
    }
  }
  matrix_start[num_vec] = num_new_nz;
  HighsStatus return_status = HighsStatus::kOk;
  if (error_found)
    return_status = HighsStatus::kError;
  else if (warning_found)
    return_status = HighsStatus::kWarning;
  return return_status;
}